

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O2

Saig_MvObj_t * Saig_ManCreateReducedAig(Aig_Man_t *p,Vec_Ptr_t **pvFlops)

{
  Aig_Obj_t *pAVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  Saig_MvObj_t *pSVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  Saig_MvObj_t *Entry;
  
  pVVar5 = Vec_PtrAlloc(p->nRegs);
  *pvFlops = pVVar5;
  pVVar5 = p->vObjs;
  uVar10 = (ulong)pVVar5->nSize;
  pSVar6 = (Saig_MvObj_t *)calloc(uVar10 + 1,0xc);
  lVar11 = 0;
  Entry = pSVar6;
  do {
    if ((int)uVar10 <= lVar11) {
      pSVar6[(int)uVar10].field_0x8 = pSVar6[(int)uVar10].field_0x8 | 7;
      return pSVar6;
    }
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,(int)lVar11);
    if (pAVar7 != (Aig_Obj_t *)0x0) {
      *(uint *)&Entry->field_0x8 =
           *(uint *)&Entry->field_0x8 & 0xfffffff8 | *(uint *)&pAVar7->field_0x18 & 7;
      if ((lVar11 == 0) || (((uint)*(undefined8 *)&pAVar7->field_0x18 & 7) == 2)) {
        iVar3 = Saig_ObjIsLo(p,pAVar7);
        if (iVar3 != 0) {
          iVar3 = Saig_ObjIsLo(p,pAVar7);
          if (iVar3 == 0) {
            __assert_fail("Saig_ObjIsLo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                          ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
          }
          pVVar5 = p->vCos;
          iVar3 = p->nTruePos;
          iVar4 = Aig_ObjCioId(pAVar7);
          pvVar8 = Vec_PtrEntry(pVVar5,(iVar3 + iVar4) - p->nTruePis);
          Entry->iFan0 = *(int *)((long)pvVar8 + 0x24) * 2;
          Entry->iFan1 = -1;
          Vec_PtrPush(*pvFlops,Entry);
        }
      }
      else {
        pAVar1 = pAVar7->pFanin0;
        uVar9 = 0xfffffffe;
        uVar2 = uVar9;
        if (pAVar1 != (Aig_Obj_t *)0x0) {
          uVar2 = *(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24) * 2;
        }
        Entry->iFan0 = (uint)pAVar1 & 1 | uVar2;
        uVar2 = (uint)*(undefined8 *)&pAVar7->field_0x18;
        if ((uVar2 & 7) != 3) {
          if ((uVar2 & 7) - 7 < 0xfffffffe) {
            __assert_fail("Aig_ObjIsNode(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSimMv.c"
                          ,0x9a,"Saig_MvObj_t *Saig_ManCreateReducedAig(Aig_Man_t *, Vec_Ptr_t **)")
            ;
          }
          pAVar7 = pAVar7->pFanin1;
          if (pAVar7 != (Aig_Obj_t *)0x0) {
            uVar9 = *(int *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x24) * 2;
          }
          Entry->iFan1 = (uint)pAVar7 & 1 | uVar9;
        }
      }
    }
    lVar11 = lVar11 + 1;
    pVVar5 = p->vObjs;
    uVar10 = (ulong)(uint)pVVar5->nSize;
    Entry = Entry + 1;
  } while( true );
}

Assistant:

Saig_MvObj_t * Saig_ManCreateReducedAig( Aig_Man_t * p, Vec_Ptr_t ** pvFlops )
{
    Saig_MvObj_t * pAig, * pEntry;
    Aig_Obj_t * pObj;
    int i;
    *pvFlops = Vec_PtrAlloc( Aig_ManRegNum(p) );
    pAig = ABC_CALLOC( Saig_MvObj_t, Aig_ManObjNumMax(p)+1 );
    Aig_ManForEachObj( p, pObj, i )
    {
        pEntry = pAig + i;
        pEntry->Type = pObj->Type;
        if ( Aig_ObjIsCi(pObj) || i == 0 )
        {
            if ( Saig_ObjIsLo(p, pObj) )
            {
                pEntry->iFan0 = (Saig_ObjLoToLi(p, pObj)->Id << 1);
                pEntry->iFan1 = -1;
                Vec_PtrPush( *pvFlops, pEntry );
            }
            continue;
        }
        pEntry->iFan0 = (Aig_ObjFaninId0(pObj) << 1) | Aig_ObjFaninC0(pObj);
        if ( Aig_ObjIsCo(pObj) )
            continue;
        assert( Aig_ObjIsNode(pObj) );
        pEntry->iFan1 = (Aig_ObjFaninId1(pObj) << 1) | Aig_ObjFaninC1(pObj);
    }
    pEntry = pAig + Aig_ManObjNumMax(p);
    pEntry->Type = AIG_OBJ_VOID;
    return pAig;
}